

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<unsigned_long>::Matcher(Matcher<unsigned_long> *this,unsigned_long value)

{
  ComparisonBase<testing::internal::EqMatcher<unsigned_long>,_unsigned_long,_testing::internal::AnyEq>
  local_38;
  Matcher<unsigned_long> local_30;
  unsigned_long local_18;
  unsigned_long value_local;
  Matcher<unsigned_long> *this_local;
  
  local_18 = value;
  value_local = (unsigned_long)this;
  testing::internal::MatcherBase<unsigned_long>::MatcherBase
            (&this->super_MatcherBase<unsigned_long>);
  (this->super_MatcherBase<unsigned_long>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_003ceef8;
  local_38.rhs_ = (unsigned_long)Eq<unsigned_long>(local_18);
  Matcher<testing::internal::EqMatcher<unsigned_long>,void>
            (&local_30,(EqMatcher<unsigned_long> *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }